

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O0

uint32_t hash(uint32_t a)

{
  value_type vVar1;
  value_type vVar2;
  uint uVar3;
  reference pvVar4;
  uint32_t a_local;
  
  pvVar4 = std::array<unsigned_int,_6UL>::operator[](&c,0);
  uVar3 = *pvVar4;
  pvVar4 = std::array<unsigned_int,_6UL>::operator[](&c,1);
  uVar3 = a ^ uVar3 ^ a >> ((byte)*pvVar4 & 0x1f);
  pvVar4 = std::array<unsigned_int,_6UL>::operator[](&c,2);
  vVar1 = *pvVar4;
  pvVar4 = std::array<unsigned_int,_6UL>::operator[](&c,2);
  uVar3 = (uVar3 << ((byte)vVar1 & 0x1f)) * (uint)(*pvVar4 != 0) + uVar3;
  pvVar4 = std::array<unsigned_int,_6UL>::operator[](&c,3);
  vVar1 = *pvVar4;
  pvVar4 = std::array<unsigned_int,_6UL>::operator[](&c,3);
  vVar2 = *pvVar4;
  pvVar4 = std::array<unsigned_int,_6UL>::operator[](&c,4);
  uVar3 = (*pvVar4 + 1) * ((uVar3 >> ((byte)vVar1 & 0x1f)) * (uint)(vVar2 != 0) ^ uVar3);
  pvVar4 = std::array<unsigned_int,_6UL>::operator[](&c,5);
  vVar1 = *pvVar4;
  pvVar4 = std::array<unsigned_int,_6UL>::operator[](&c,5);
  return (uVar3 >> ((byte)vVar1 & 0x1f)) * (uint)(*pvVar4 != 0) ^ uVar3;
}

Assistant:

static uint32_t hash(uint32_t a){
    a =  (a ^ c[0]) ^ (a >> c[1]);
    a += (a << c[2])*(c[2]!=0);
    a ^= (a >> c[3])*(c[3]!=0);
    a *= c[4]+1;
    a ^= (a >> c[5])*(c[5]!=0);
    return a;
}